

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

bool __thiscall
despot::util::tinyxml::TiXmlPrinter::VisitEnter
          (TiXmlPrinter *this,TiXmlElement *element,TiXmlAttribute *firstAttribute)

{
  TiXmlString *this_00;
  TiXmlNode *pTVar1;
  Rep *pRVar2;
  int iVar3;
  size_t len;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_EDX;
  char *__s;
  
  DoIndent(this);
  this_00 = &this->buffer;
  TiXmlString::append(this_00,"<",1);
  __s = ((element->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::append(this_00,__s,len);
  if (firstAttribute != (TiXmlAttribute *)0x0) {
    do {
      TiXmlString::append(this_00," ",1);
      TiXmlAttribute::Print(firstAttribute,(FILE *)0x0,extraout_EDX,this_00);
      firstAttribute = firstAttribute->next;
      if ((((firstAttribute->value).rep_)->size == 0) && (((firstAttribute->name).rep_)->size == 0))
      {
        firstAttribute = (TiXmlAttribute *)0x0;
      }
    } while (firstAttribute != (TiXmlAttribute *)0x0);
  }
  if ((element->super_TiXmlNode).firstChild == (TiXmlNode *)0x0) {
    TiXmlString::append(this_00," />",3);
  }
  else {
    TiXmlString::append(this_00,">",1);
    iVar3 = (*(((element->super_TiXmlNode).firstChild)->super_TiXmlBase)._vptr_TiXmlBase[8])();
    if (((CONCAT44(extraout_var,iVar3) != 0) &&
        (pTVar1 = (element->super_TiXmlNode).firstChild,
        (element->super_TiXmlNode).lastChild == pTVar1)) &&
       (iVar3 = (*(pTVar1->super_TiXmlBase)._vptr_TiXmlBase[8])(),
       *(char *)(CONCAT44(extraout_var_00,iVar3) + 0x50) == '\0')) {
      this->simpleTextPrint = true;
      goto LAB_00172486;
    }
  }
  pRVar2 = (this->lineBreak).rep_;
  TiXmlString::append(this_00,pRVar2->str,pRVar2->size);
LAB_00172486:
  this->depth = this->depth + 1;
  return true;
}

Assistant:

bool TiXmlPrinter::VisitEnter(const TiXmlElement& element,
	const TiXmlAttribute* firstAttribute) {
	DoIndent();
	buffer += "<";
	buffer += element.Value();

	for (const TiXmlAttribute* attrib = firstAttribute; attrib;
		attrib = attrib->Next()) {
		buffer += " ";
		attrib->Print(0, 0, &buffer);
	}

	if (!element.FirstChild()) {
		buffer += " />";
		DoLineBreak();
	} else {
		buffer += ">";
		if (element.FirstChild()->ToText()
			&& element.LastChild() == element.FirstChild()
			&& element.FirstChild()->ToText()->CDATA() == false) {
			simpleTextPrint = true;
			// no DoLineBreak()!
		} else {
			DoLineBreak();
		}
	}
	++depth;
	return true;
}